

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xboxskin.cpp
# Opt level: O2

void rw::xbox::skinUninstanceCB(Geometry *geo,InstanceDataHeader *header)

{
  Skin *this;
  void *pvVar1;
  int32 j;
  long lVar2;
  ulong uVar3;
  uint8 *puVar4;
  float *pfVar5;
  ushort *puVar6;
  int32 iVar7;
  ulong uVar8;
  bool bVar9;
  uint8 local_4c [4];
  float local_48 [6];
  
  defaultUninstanceCB(geo,header);
  this = *(Skin **)((long)geo->texCoords + (long)skinGlobals + -0x38);
  if (this != (Skin *)0x0) {
    pvVar1 = this->platformData;
    puVar4 = this->data;
    pfVar5 = this->inverseMatrices;
    Skin::init(this,(EVP_PKEY_CTX *)(ulong)(uint)this->numBones);
    memcpy(this->inverseMatrices,pfVar5,(long)this->numBones << 6);
    (*DAT_00145dd0)(puVar4);
    for (lVar2 = 0; lVar2 < this->numUsedBones; lVar2 = lVar2 + 1) {
      this->usedBones[lVar2] = *(uint8 *)((long)pvVar1 + lVar2 * 4);
    }
    puVar4 = this->indices;
    pfVar5 = this->weights;
    puVar6 = *(ushort **)((long)pvVar1 + 0x808);
    iVar7 = header->numVertices;
    while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
      local_48[0] = 0.0;
      local_48[1] = 0.0;
      local_48[2] = 0.0;
      local_48[3] = 0.0;
      local_4c[0] = '\0';
      local_4c[1] = '\0';
      local_4c[2] = '\0';
      local_4c[3] = '\0';
      uVar8 = (ulong)(uint)this->numWeights;
      if (this->numWeights < 1) {
        uVar8 = 0;
      }
      for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
        local_48[uVar3] = (float)*(byte *)((long)puVar6 + uVar3) / 255.0;
      }
      puVar6 = (ushort *)((long)puVar6 + uVar3);
      for (uVar3 = 0; uVar8 != uVar3; uVar3 = uVar3 + 1) {
        local_4c[uVar3] = *(uint8 *)((long)pvVar1 + (ulong)(*puVar6 / 3) * 4);
        if ((local_48[uVar3] == 0.0) && (!NAN(local_48[uVar3]))) {
          local_4c[uVar3] = '\0';
        }
        puVar6 = puVar6 + 1;
      }
      for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
        *pfVar5 = local_48[lVar2];
        pfVar5 = pfVar5 + 1;
        puVar4[lVar2] = local_4c[lVar2];
      }
      puVar4 = puVar4 + 4;
    }
    (*DAT_00145dd0)(*(undefined8 *)((long)pvVar1 + 0x808));
    (*DAT_00145dd0)(pvVar1);
  }
  return;
}

Assistant:

void
skinUninstanceCB(Geometry *geo, InstanceDataHeader *header)
{
	defaultUninstanceCB(geo, header);

	Skin *skin = Skin::get(geo);
	if(skin == nil)
		return;
	NativeSkin *natskin = (NativeSkin*)skin->platformData;

	uint8 *data = skin->data;
	float *invMats = skin->inverseMatrices;
	skin->init(skin->numBones, natskin->numUsedBones, geo->numVertices);
	memcpy(skin->inverseMatrices, invMats, skin->numBones*64);
	rwFree(data);

	for(int32 j = 0; j < skin->numUsedBones; j++)
		skin->usedBones[j] = natskin->table1[j];

	float *weights = skin->weights;
	uint8 *indices = skin->indices;
	uint8 *p = (uint8*)natskin->vertexBuffer;
	int32 numVertices = header->numVertices;
	float w[4];
	uint8 i[4];
	uint16 *ip;
	while(numVertices--){
		w[0] = w[1] = w[2] = w[3] = 0.0f;
		i[0] = i[1] = i[2] = i[3] = 0;

		for(int32 j = 0; j < skin->numWeights; j++)
			w[j] = *p++/255.0f;

		ip = (uint16*)p;
		for(int32 j = 0; j < skin->numWeights; j++){
			i[j] = natskin->table1[*ip++/3];
			if(w[j] == 0.0f) i[j] = 0;	// clean up a bit
		}
		p = (uint8*)ip;

		for(int32 j = 0; j < 4; j++){
			*weights++ = w[j];
			*indices++ = i[j];
		}
	}

	rwFree(natskin->vertexBuffer);
	rwFree(natskin);
}